

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::ri::EglConfigSet::~EglConfigSet(EglConfigSet *this)

{
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__EglConfigSet_001277e0;
  List::~List(&this->configs);
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

~EglConfigSet		(void) {}